

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupAppendNew(Gia_Man_t *pOne,Gia_Man_t *pTwo)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  
  p = Gia_ManStart(pTwo->nObjs + pOne->nObjs);
  pcVar4 = Abc_UtilStrsav(pOne->pName);
  p->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(pOne->pSpec);
  p->pSpec = pcVar4;
  Gia_ManHashAlloc(p);
  pOne->pObjs->Value = 0;
  for (iVar7 = 1; iVar7 < pOne->nObjs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManObj(pOne,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar1 = (uint)*(undefined8 *)pGVar5;
    if ((~uVar1 & 0x1fffffff) == 0 || (int)uVar1 < 0) {
      if ((uVar1 & 0x9fffffff) == 0x9fffffff) {
        uVar1 = Gia_ManAppendCi(p);
        goto LAB_001d4fdc;
      }
    }
    else {
      iVar2 = Gia_ObjFanin0Copy(pGVar5);
      iVar3 = Gia_ObjFanin1Copy(pGVar5);
      uVar1 = Gia_ManHashAnd(p,iVar2,iVar3);
LAB_001d4fdc:
      pGVar5->Value = uVar1;
    }
  }
  pTwo->pObjs->Value = 0;
  for (iVar7 = 1; iVar7 < pTwo->nObjs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManObj(pTwo,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) == 0 || (int)*(uint *)pGVar5 < 0) {
      iVar2 = Gia_ObjIsPi(pTwo,pGVar5);
      if (iVar2 != 0) {
        iVar2 = Gia_ObjCioId(pGVar5);
        pGVar6 = Gia_ManPi(pOne,iVar2);
        uVar1 = pGVar6->Value;
        goto LAB_001d506b;
      }
      if (((undefined1  [12])*pGVar5 & (undefined1  [12])0x9fffffff) == (undefined1  [12])0x9fffffff
         ) {
        uVar1 = Gia_ManAppendCi(p);
        goto LAB_001d506b;
      }
    }
    else {
      iVar2 = Gia_ObjFanin0Copy(pGVar5);
      iVar3 = Gia_ObjFanin1Copy(pGVar5);
      uVar1 = Gia_ManHashAnd(p,iVar2,iVar3);
LAB_001d506b:
      pGVar5->Value = uVar1;
    }
  }
  Gia_ManHashStop(p);
  for (iVar7 = 0; iVar7 < pOne->vCos->nSize - pOne->nRegs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManCo(pOne,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar5);
    uVar1 = Gia_ManAppendCo(p,iVar2);
    pGVar5->Value = uVar1;
  }
  for (iVar7 = 0; iVar7 < pTwo->vCos->nSize - pTwo->nRegs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManCo(pTwo,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar5);
    uVar1 = Gia_ManAppendCo(p,iVar2);
    pGVar5->Value = uVar1;
  }
  for (iVar7 = 0; iVar7 < pOne->nRegs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManCo(pOne,(pOne->vCos->nSize - pOne->nRegs) + iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar5);
    uVar1 = Gia_ManAppendCo(p,iVar2);
    pGVar5->Value = uVar1;
  }
  iVar7 = 0;
  do {
    iVar2 = pTwo->nRegs;
    if (iVar2 <= iVar7) {
LAB_001d519d:
      Gia_ManSetRegNum(p,iVar2 + pOne->nRegs);
      return p;
    }
    pGVar5 = Gia_ManCo(pTwo,(pTwo->vCos->nSize - iVar2) + iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) {
      iVar2 = pTwo->nRegs;
      goto LAB_001d519d;
    }
    iVar2 = Gia_ObjFanin0Copy(pGVar5);
    uVar1 = Gia_ManAppendCo(p,iVar2);
    pGVar5->Value = uVar1;
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManDupAppendNew( Gia_Man_t * pOne, Gia_Man_t * pTwo )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(pOne) + Gia_ManObjNum(pTwo) );
    pNew->pName = Abc_UtilStrsav( pOne->pName );
    pNew->pSpec = Abc_UtilStrsav( pOne->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(pOne)->Value = 0;
    Gia_ManForEachObj1( pOne, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    Gia_ManConst0(pTwo)->Value = 0;
    Gia_ManForEachObj1( pTwo, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsPi(pTwo, pObj) )
            pObj->Value = Gia_ManPi(pOne, Gia_ObjCioId(pObj))->Value;
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    Gia_ManHashStop( pNew );
    // primary outputs
    Gia_ManForEachPo( pOne, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachPo( pTwo, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // flop inputs
    Gia_ManForEachRi( pOne, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( pTwo, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(pOne) + Gia_ManRegNum(pTwo) );
    return pNew;
}